

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::AbortedRead::tryRead
          (AbortedRead *this,void *readBufferPtr,size_t minBytes,size_t maxBytes)

{
  Array<char> local_1c0;
  Exception local_1a8;
  
  kj::_::Debug::makeDescription<char_const(&)[28]>
            ((String *)&local_1c0,(Debug *)0x458868,"abortRead() has been called",
             (char (*) [28])maxBytes);
  Exception::Exception
            (&local_1a8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x588,(String *)&local_1c0);
  Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,&local_1a8);
  Exception::~Exception(&local_1a8);
  Array<char>::~Array(&local_1c0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* readBufferPtr, size_t minBytes, size_t maxBytes) override {
      return KJ_EXCEPTION(DISCONNECTED, "abortRead() has been called");
    }